

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageImplementation::ImageImplementation
          (ImageImplementation *this,OperationContext *context,Resource *resource,
          VkShaderStageFlagBits stage,string *shaderPrefix,AccessMode mode,PipelineType pipelineType
          ,DispatchCall dispatchCall)

{
  VkImageSubresourceRange *pVVar1;
  VkFormat VVar2;
  VkImageType imageType;
  DispatchCall dispatchCall_00;
  VkDescriptorPool descriptorPool;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data_00;
  PtrData<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data_03;
  RefData<vk::Handle<(vk::HandleType)19>_> data_04;
  RefData<vk::Handle<(vk::HandleType)21>_> data_05;
  RefData<vk::Handle<(vk::HandleType)22>_> data_06;
  Allocator *pAVar3;
  VkPhysicalDevice pVVar4;
  InstanceInterface *pIVar5;
  string *psVar6;
  VkShaderStageFlagBits stage_00;
  Resource *pRVar7;
  bool bVar8;
  VkPipelineStageFlags VVar9;
  VkImageViewType VVar10;
  ImageResource *pIVar11;
  VkDeviceSize VVar12;
  Buffer *pBVar13;
  void *pvVar14;
  Image *pIVar15;
  ImageResource *pIVar16;
  VkImage *pVVar17;
  DescriptorSetLayoutBuilder *pDVar18;
  DescriptorPoolBuilder *pDVar19;
  Handle<(vk::HandleType)21> *pHVar20;
  Handle<(vk::HandleType)19> *pHVar21;
  Handle<(vk::HandleType)13> *pHVar22;
  Handle<(vk::HandleType)22> *pHVar23;
  DescriptorSetUpdateBuilder *pDVar24;
  GraphicsPipeline *this_00;
  Buffer *in_stack_fffffffffffff9b8;
  Pipeline *pPVar25;
  undefined8 in_stack_fffffffffffff9c0;
  DeviceInterface *pDVar26;
  DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline> local_469;
  deUint64 local_468;
  undefined1 local_459;
  GraphicsPipeline *local_458;
  DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline> local_449;
  deUint64 local_448;
  undefined1 local_439;
  GraphicsPipeline *local_438;
  PtrData<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  local_430;
  PtrData<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  *local_420;
  Location local_410;
  VkDescriptorSet local_408;
  Location local_400;
  VkDescriptorSet local_3f8;
  DescriptorSetUpdateBuilder local_3f0;
  deUint64 local_3a8;
  VkSampler local_3a0;
  undefined1 local_398 [8];
  VkDescriptorImageInfo dstImageInfo;
  VkSampler local_378;
  undefined1 local_370 [8];
  VkDescriptorImageInfo srcImageInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_348;
  RefData<vk::Handle<(vk::HandleType)22>_> local_328;
  DescriptorPoolBuilder local_308;
  Move<vk::Handle<(vk::HandleType)21>_> local_2f0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_2d0;
  DescriptorSetLayoutBuilder local_2b0;
  Move<vk::Handle<(vk::HandleType)19>_> local_268;
  RefData<vk::Handle<(vk::HandleType)19>_> local_248;
  undefined8 local_228;
  undefined8 uStack_220;
  deUint32 local_218;
  VkImage local_210;
  Move<vk::Handle<(vk::HandleType)13>_> local_208;
  RefData<vk::Handle<(vk::HandleType)13>_> local_1e8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  deUint32 local_1b8;
  VkImage local_1b0;
  Move<vk::Handle<(vk::HandleType)13>_> local_1a8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_188;
  VkImageViewType local_164;
  DefaultDeleter<vkt::synchronization::Image> local_15d;
  VkImageViewType viewType;
  VkImageCreateInfo local_158;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> local_100;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *local_f0;
  VkDeviceMemory local_e0;
  Allocation *local_d8;
  Allocation *alloc;
  VkBufferCreateInfo local_c8;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> local_90;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_80
  ;
  Allocator *local_70;
  Allocator *allocator;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  AccessMode local_34;
  string *psStack_30;
  AccessMode mode_local;
  string *shaderPrefix_local;
  Resource *pRStack_20;
  VkShaderStageFlagBits stage_local;
  Resource *resource_local;
  OperationContext *context_local;
  ImageImplementation *this_local;
  
  local_34 = mode;
  psStack_30 = shaderPrefix;
  shaderPrefix_local._4_4_ = stage;
  pRStack_20 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  Operation::Operation(&this->super_Operation);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__ImageImplementation_016b3608;
  this->m_context = (OperationContext *)resource_local;
  this->m_resource = pRStack_20;
  this->m_stage = shaderPrefix_local._4_4_;
  VVar9 = pipelineStageFlagsFromShaderStageFlagBits(this->m_stage);
  this->m_pipelineStage = VVar9;
  this->m_mode = local_34;
  this->m_dispatchCall = dispatchCall;
  pIVar11 = Resource::getImage(this->m_resource);
  VVar2 = pIVar11->format;
  pIVar11 = Resource::getImage(this->m_resource);
  VVar12 = getPixelBufferSize(VVar2,&pIVar11->extent);
  this->m_hostBufferSizeBytes = VVar12;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            (&this->m_hostBuffer);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            (&this->m_image);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_srcImageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_dstImageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  de::details::
  MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  ::MovePtr(&this->m_pipeline);
  vki = (InstanceInterface *)OperationContext::getDeviceInterface(this->m_context);
  device = (VkDevice)OperationContext::getInstanceInterface(this->m_context);
  physDevice = (VkPhysicalDevice)OperationContext::getDevice(this->m_context);
  allocator = (Allocator *)OperationContext::getPhysicalDevice(this->m_context);
  local_70 = OperationContext::getAllocator(this->m_context);
  requireFeaturesForSSBOAccess(this->m_context,this->m_stage);
  pIVar11 = Resource::getImage(this->m_resource);
  bVar8 = isStorageImageExtendedFormat(pIVar11->format);
  if (bVar8) {
    requireFeatures((InstanceInterface *)device,(VkPhysicalDevice)allocator,0x40);
  }
  pBVar13 = (Buffer *)operator_new(0x30);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pAVar3 = local_70;
  makeBufferCreateInfo(&local_c8,this->m_hostBufferSizeBytes,3);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  synchronization::Buffer::Buffer
            (pBVar13,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,pAVar3,&local_c8,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::synchronization::Buffer>::DefaultDeleter
            ((DefaultDeleter<vkt::synchronization::Buffer> *)((long)&alloc + 3));
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            ((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_90);
  local_80 = de::details::MovePtr::operator_cast_to_PtrData(&local_90,(MovePtr *)pBVar13);
  data._8_8_ = in_stack_fffffffffffff9c0;
  data.ptr = in_stack_fffffffffffff9b8;
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  operator=(&this->m_hostBuffer,data);
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::~MovePtr
            ((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_90);
  pBVar13 = de::details::
            UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            ::operator->(&(this->m_hostBuffer).
                          super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                        );
  local_d8 = synchronization::Buffer::getAllocation(pBVar13);
  if (this->m_mode == ACCESS_MODE_READ) {
    pvVar14 = ::vk::Allocation::getHostPtr(local_d8);
    ::deMemset(pvVar14,0,this->m_hostBufferSizeBytes);
  }
  else {
    pvVar14 = ::vk::Allocation::getHostPtr(local_d8);
    fillPattern(pvVar14,this->m_hostBufferSizeBytes);
  }
  pIVar5 = vki;
  pVVar4 = physDevice;
  local_e0 = ::vk::Allocation::getMemory(local_d8);
  VVar12 = ::vk::Allocation::getOffset(local_d8);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pIVar5,(VkDevice)pVVar4,local_e0,VVar12,this->m_hostBufferSizeBytes)
  ;
  pIVar15 = (Image *)operator_new(0x30);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pAVar3 = local_70;
  pIVar11 = Resource::getImage(this->m_resource);
  imageType = pIVar11->imageType;
  pIVar11 = Resource::getImage(this->m_resource);
  pIVar16 = Resource::getImage(this->m_resource);
  makeImageCreateInfo(&local_158,imageType,&pIVar11->extent,pIVar16->format,0xb);
  viewType = ::vk::MemoryRequirement::Any.m_flags;
  synchronization::Image::Image
            (pIVar15,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,pAVar3,&local_158,
             ::vk::MemoryRequirement::Any);
  de::DefaultDeleter<vkt::synchronization::Image>::DefaultDeleter(&local_15d);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::MovePtr
            ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_100);
  local_f0 = de::details::MovePtr::operator_cast_to_PtrData(&local_100,(MovePtr *)pIVar15);
  data_00._8_8_ = in_stack_fffffffffffff9c0;
  data_00.ptr = (Image *)in_stack_fffffffffffff9b8;
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::operator=
            (&this->m_image,data_00);
  de::details::
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::~MovePtr
            ((MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_100);
  if (this->m_mode == ACCESS_MODE_READ) {
    pIVar11 = Resource::getImage(this->m_resource);
    this->m_srcImage = &pIVar11->handle;
    pIVar15 = de::details::
              UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              ::operator*(&(this->m_image).
                           super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                         );
    pVVar17 = synchronization::Image::operator*(pIVar15);
    this->m_dstImage = pVVar17;
  }
  else {
    pIVar15 = de::details::
              UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              ::operator*(&(this->m_image).
                           super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                         );
    pVVar17 = synchronization::Image::operator*(pIVar15);
    this->m_srcImage = pVVar17;
    pIVar11 = Resource::getImage(this->m_resource);
    this->m_dstImage = &pIVar11->handle;
  }
  pIVar11 = Resource::getImage(this->m_resource);
  VVar10 = getImageViewType(pIVar11->imageType);
  pIVar5 = vki;
  pVVar4 = physDevice;
  local_1b0.m_internal = this->m_srcImage->m_internal;
  local_164 = VVar10;
  pIVar11 = Resource::getImage(this->m_resource);
  VVar2 = pIVar11->format;
  pIVar11 = Resource::getImage(this->m_resource);
  local_1b8 = (pIVar11->subresourceRange).layerCount;
  pVVar1 = &pIVar11->subresourceRange;
  local_1c8._0_4_ = pVVar1->aspectMask;
  local_1c8._4_4_ = pVVar1->baseMipLevel;
  uStack_1c0._0_4_ = (pIVar11->subresourceRange).levelCount;
  uStack_1c0._4_4_ = (pIVar11->subresourceRange).baseArrayLayer;
  makeImageView(&local_1a8,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,local_1b0,VVar10,VVar2,*pVVar1
               );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&local_1a8);
  data_02.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data_02.object.m_internal = local_188.object.m_internal;
  data_02.deleter.m_device._0_4_ = (int)local_188.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_188.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_srcImageView,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_1a8);
  pIVar5 = vki;
  pVVar4 = physDevice;
  VVar10 = local_164;
  local_210.m_internal = this->m_dstImage->m_internal;
  pIVar11 = Resource::getImage(this->m_resource);
  VVar2 = pIVar11->format;
  pIVar11 = Resource::getImage(this->m_resource);
  local_218 = (pIVar11->subresourceRange).layerCount;
  pVVar1 = &pIVar11->subresourceRange;
  local_228._0_4_ = pVVar1->aspectMask;
  local_228._4_4_ = pVVar1->baseMipLevel;
  uStack_220._0_4_ = (pIVar11->subresourceRange).levelCount;
  uStack_220._4_4_ = (pIVar11->subresourceRange).baseArrayLayer;
  makeImageView(&local_208,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,local_210,VVar10,VVar2,*pVVar1
               );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e8,(Move *)&local_208);
  data_03.deleter.m_deviceIface = local_1e8.deleter.m_deviceIface;
  data_03.object.m_internal = local_1e8.object.m_internal;
  data_03.deleter.m_device._0_4_ = (int)local_1e8.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_1e8.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator = local_1e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_dstImageView,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_208);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_2b0);
  pDVar18 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_2b0,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,this->m_stage);
  pDVar18 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar18,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,this->m_stage);
  ::vk::DescriptorSetLayoutBuilder::build
            (&local_268,pDVar18,(DeviceInterface *)vki,(VkDevice)physDevice,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_248,(Move *)&local_268);
  data_04.deleter.m_deviceIface = local_248.deleter.m_deviceIface;
  data_04.object.m_internal = local_248.object.m_internal;
  data_04.deleter.m_device._0_4_ = (int)local_248.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_248.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator = local_248.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_268);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_2b0);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_308);
  pDVar19 = ::vk::DescriptorPoolBuilder::addType(&local_308,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  pDVar19 = ::vk::DescriptorPoolBuilder::addType(pDVar19,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            (&local_2f0,pDVar19,(DeviceInterface *)vki,(VkDevice)physDevice,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d0,(Move *)&local_2f0);
  data_05.deleter.m_deviceIface = local_2d0.deleter.m_deviceIface;
  data_05.object.m_internal = local_2d0.object.m_internal;
  data_05.deleter.m_device._0_4_ = (int)local_2d0.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_2d0.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator = local_2d0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_2f0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_308);
  pIVar5 = vki;
  pVVar4 = physDevice;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorPool.m_internal = pHVar20->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                      );
  srcImageInfo._16_8_ = pHVar21->m_internal;
  makeDescriptorSet(&local_348,(DeviceInterface *)pIVar5,(VkDevice)pVVar4,descriptorPool,
                    (VkDescriptorSetLayout)srcImageInfo._16_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_328,(Move *)&local_348);
  data_06.deleter.m_deviceIface = local_328.deleter.m_deviceIface;
  data_06.object.m_internal = local_328.object.m_internal;
  data_06.deleter.m_device._0_4_ = (int)local_328.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_328.deleter.m_device >> 0x20);
  data_06.deleter.m_pool.m_internal = local_328.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_06)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_348);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_378,0);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_srcImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  dstImageInfo._16_8_ = pHVar22->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_370,local_378,(VkImageView)dstImageInfo._16_8_,
             VK_IMAGE_LAYOUT_GENERAL);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_3a0,0);
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_dstImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  local_3a8 = pHVar22->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_398,local_3a0,(VkImageView)local_3a8,
             VK_IMAGE_LAYOUT_GENERAL);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_3f0);
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_3f8.m_internal = pHVar23->m_internal;
  local_400 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar24 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_3f0,local_3f8,&local_400,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       (VkDescriptorImageInfo *)local_370);
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_408.m_internal = pHVar23->m_internal;
  local_410 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar24 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar24,local_408,&local_410,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       (VkDescriptorImageInfo *)local_398);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar24,(DeviceInterface *)vki,(VkDevice)physDevice);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_3f0);
  local_439 = 0;
  local_459 = 0;
  if (pipelineType == PIPELINE_TYPE_GRAPHICS) {
    this_00 = (GraphicsPipeline *)operator_new(0x120);
    pRVar7 = resource_local;
    stage_00 = shaderPrefix_local._4_4_;
    psVar6 = psStack_30;
    local_439 = 1;
    local_438 = this_00;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        (&(this->m_descriptorSetLayout).
                          super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    local_448 = pHVar21->m_internal;
    GraphicsPipeline::GraphicsPipeline
              (this_00,(OperationContext *)pRVar7,stage_00,psVar6,(VkDescriptorSetLayout)local_448);
    de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>::DefaultDeleter
              (&local_449);
    de::details::
    MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
    ::MovePtr((MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
               *)&local_430);
    pPVar25 = (Pipeline *)local_328.object.m_internal;
    pDVar26 = local_328.deleter.m_deviceIface;
  }
  else {
    this_00 = (GraphicsPipeline *)operator_new(0x60);
    pRVar7 = resource_local;
    psVar6 = psStack_30;
    local_459 = 1;
    dispatchCall_00 = this->m_dispatchCall;
    local_458 = this_00;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        (&(this->m_descriptorSetLayout).
                          super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    local_468 = pHVar21->m_internal;
    ComputePipeline::ComputePipeline
              ((ComputePipeline *)this_00,(OperationContext *)pRVar7,dispatchCall_00,psVar6,
               (VkDescriptorSetLayout)local_468);
    de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>::DefaultDeleter
              (&local_469);
    de::details::
    MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
    ::MovePtr((MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
               *)&local_430);
    pPVar25 = (Pipeline *)local_328.object.m_internal;
    pDVar26 = local_328.deleter.m_deviceIface;
  }
  local_420 = de::details::MovePtr::operator_cast_to_PtrData(&local_430,(MovePtr *)this_00);
  data_01._8_8_ = pDVar26;
  data_01.ptr = pPVar25;
  de::details::
  MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  ::operator=(&this->m_pipeline,data_01);
  de::details::
  MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  ::~MovePtr((MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
              *)&local_430);
  return;
}

Assistant:

ImageImplementation (OperationContext&				context,
						 Resource&						resource,
						 const VkShaderStageFlagBits	stage,
						 const std::string&				shaderPrefix,
						 const AccessMode				mode,
						 const PipelineType				pipelineType,
						 const DispatchCall				dispatchCall)
		: m_context				(context)
		, m_resource			(resource)
		, m_stage				(stage)
		, m_pipelineStage		(pipelineStageFlagsFromShaderStageFlagBits(m_stage))
		, m_mode				(mode)
		, m_dispatchCall		(dispatchCall)
		, m_hostBufferSizeBytes	(getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent))
	{
		const DeviceInterface&		vk			= m_context.getDeviceInterface();
		const InstanceInterface&	vki			= m_context.getInstanceInterface();
		const VkDevice				device		= m_context.getDevice();
		const VkPhysicalDevice		physDevice	= m_context.getPhysicalDevice();
		Allocator&					allocator	= m_context.getAllocator();

		// Image stores are always required, in either access mode.
		requireFeaturesForSSBOAccess(m_context, m_stage);

		// Some storage image formats require additional capability.
		if (isStorageImageExtendedFormat(m_resource.getImage().format))
			requireFeatures(vki, physDevice, FEATURE_SHADER_STORAGE_IMAGE_EXTENDED_FORMATS);

		m_hostBuffer = de::MovePtr<Buffer>(new Buffer(
			vk, device, allocator, makeBufferCreateInfo(m_hostBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
			MemoryRequirement::HostVisible));

		// Init host buffer data
		{
			const Allocation& alloc = m_hostBuffer->getAllocation();
			if (m_mode == ACCESS_MODE_READ)
				deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(m_hostBufferSizeBytes));
			else
				fillPattern(alloc.getHostPtr(), m_hostBufferSizeBytes);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_hostBufferSizeBytes);
		}

		// Image resources
		{
			m_image = de::MovePtr<Image>(new Image(vk, device, allocator,
				makeImageCreateInfo(m_resource.getImage().imageType, m_resource.getImage().extent, m_resource.getImage().format,
									VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT),
				MemoryRequirement::Any));

			if (m_mode == ACCESS_MODE_READ)
			{
				m_srcImage = &m_resource.getImage().handle;
				m_dstImage = &(**m_image);
			}
			else
			{
				m_srcImage = &(**m_image);
				m_dstImage = &m_resource.getImage().handle;
			}

			const VkImageViewType viewType = getImageViewType(m_resource.getImage().imageType);

			m_srcImageView	= makeImageView(vk, device, *m_srcImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
			m_dstImageView	= makeImageView(vk, device, *m_dstImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
		}

		// Prepare descriptors
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.build(vk, device);

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

			const VkDescriptorImageInfo srcImageInfo = makeDescriptorImageInfo(DE_NULL, *m_srcImageView, VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo dstImageInfo = makeDescriptorImageInfo(DE_NULL, *m_dstImageView, VK_IMAGE_LAYOUT_GENERAL);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &srcImageInfo)
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &dstImageInfo)
				.update(vk, device);
		}

		// Create pipeline
		m_pipeline = (pipelineType == PIPELINE_TYPE_GRAPHICS ? de::MovePtr<Pipeline>(new GraphicsPipeline(context, stage, shaderPrefix, *m_descriptorSetLayout))
															 : de::MovePtr<Pipeline>(new ComputePipeline(context, m_dispatchCall, shaderPrefix, *m_descriptorSetLayout)));
	}